

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  bool bVar1;
  FeatureSet_RepeatedFieldEncoding FVar2;
  FeatureSet *this_00;
  FieldDescriptor *this_local;
  
  bVar1 = is_packable(this);
  if (bVar1) {
    this_00 = features(this);
    FVar2 = FeatureSet::repeated_field_encoding(this_00);
    this_local._7_1_ = FVar2 == FeatureSet_RepeatedFieldEncoding_PACKED;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  return features().repeated_field_encoding() == FeatureSet::PACKED;
}